

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

compile_errcode __thiscall Condition::Action(Condition *this)

{
  int line_number;
  int character_number;
  pointer pSVar1;
  bool bVar2;
  LogTools *pLVar3;
  SymbolName SVar4;
  compile_errcode cVar5;
  uint uVar6;
  SymbolType expression_type;
  compile_errcode local_80;
  SymbolType local_7c;
  Expression *local_78;
  string local_70;
  string local_50;
  
  local_78 = &this->m_expression;
  uVar6 = 0;
  do {
    SVar4 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (uVar6 < 4) {
      pSVar1 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      line_number = pSVar1[handle_correct_queue->m_current_locate].m_line_number;
      character_number = pSVar1[handle_correct_queue->m_current_locate].m_character_number;
      switch(uVar6) {
      case 0:
        cVar5 = Expression::Action(local_78,&local_7c);
        pLVar3 = g_log_tools;
        if (cVar5 == 0) {
          uVar6 = 1;
          if (local_7c == CHAR) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"condition must be int","");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
            LogTools::SemanticErrorLogs(pLVar3,&local_70,&local_50,line_number,character_number);
LAB_00131b3e:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
LAB_00131b66:
          Expression::LogOutput(local_78);
          goto LAB_00131b70;
        }
        local_80 = -1;
        uVar6 = 0;
        break;
      case 1:
        uVar6 = 2;
        if (SVar4 - EQUAL_SYM < 6) goto LAB_00131b70;
        local_80 = 0;
        uVar6 = 1;
        break;
      case 2:
        cVar5 = Expression::Action(local_78,&local_7c);
        pLVar3 = g_log_tools;
        if (cVar5 == 0) {
          uVar6 = 3;
          if (local_7c == CHAR) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"condition must be int","");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
            LogTools::SemanticErrorLogs(pLVar3,&local_70,&local_50,line_number,character_number);
            goto LAB_00131b3e;
          }
          goto LAB_00131b66;
        }
        local_80 = -1;
        uVar6 = 2;
        break;
      case 3:
        local_80 = 0;
      }
      bVar2 = false;
    }
    else {
LAB_00131b70:
      bVar2 = true;
      if (uVar6 == 2) {
        SymbolQueue::NextSymbol(handle_correct_queue);
      }
    }
    if (!bVar2) {
      return local_80;
    }
  } while( true );
}

Assistant:

compile_errcode Condition::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    if (expression_type == CHAR) {
                        g_log_tools->SemanticErrorLogs("condition must be int", string(""), line_number, character_number);
                    }
                    m_expression.LogOutput();
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (IsRelationalOpeartor(name)) {
                    state = 2;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    if (expression_type == CHAR) {
                        g_log_tools->SemanticErrorLogs("condition must be int", string(""), line_number, character_number);
                    }
                    m_expression.LogOutput();
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: return COMPILE_OK;
        }
        if (state == 2)
            handle_correct_queue->NextSymbol();
    }
}